

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool __thiscall
basisu::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uchar *puVar4;
  long in_RCX;
  undefined4 *in_RDX;
  byte *in_RSI;
  color_rgba *in_RDI;
  bool success;
  uint32_t sorted_pixel_index_5;
  uint32_t sorted_pixel_index_4;
  uint32_t y_2;
  uint32_t c_6;
  uint32_t cur_selector_2;
  uint32_t c_5;
  uint32_t min_error_3;
  uint32_t c_4;
  uint32_t min_error_2;
  int64_t block_error;
  uint32_t sorted_pixel_index_3;
  uint32_t sorted_pixel_index_2;
  uint32_t y_1;
  uint32_t c_3;
  uint32_t cur_selector_1;
  uint32_t sorted_pixel_index_1;
  uint32_t sorted_pixel_index;
  uint32_t y;
  uint32_t c_2;
  uint32_t cur_selector;
  uint32_t c_1;
  uint32_t min_error_1;
  uint32_t c;
  uint32_t min_error;
  color_rgba *pSrc_pixels;
  uint64_t total_error;
  uint32_t block_inten_midpoints [3];
  color_rgba block_color;
  int yd;
  uint32_t s;
  color_rgba block_colors [4];
  uint32_t block_inten [4];
  int *pInten_table;
  int inten_table;
  bool perceptual;
  uint32_t n;
  color_rgba base_color;
  int db;
  int dg;
  int dr;
  int in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecc;
  uchar in_stack_fffffffffffffecd;
  uchar in_stack_fffffffffffffece;
  uchar in_stack_fffffffffffffecf;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_stack_fffffffffffffed0;
  etc1_solution_coordinates *in_stack_fffffffffffffed8;
  anon_union_4_2_6eba8969_for_color_rgba_0 *pSrc_pixels_00;
  etc1_solution_coordinates *in_stack_fffffffffffffee0;
  anon_union_4_2_6eba8969_for_color_rgba_0 *c1;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  byte alpha;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_e8;
  ulong local_e0;
  uint local_cc;
  uint local_c8;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_a8;
  ulong local_98;
  uint local_90 [4];
  undefined4 local_80;
  uint local_7c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_78 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_68;
  int local_64;
  int local_60;
  uint local_5c;
  undefined1 *local_50;
  int local_44;
  byte local_3d;
  uint32_t local_3c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  undefined4 *local_20;
  byte *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = check_for_redundant_solution
                    ((etc1_optimizer *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)
                     ,in_stack_fffffffffffffee0);
  if (bVar1) {
    if ((*(byte *)(*(long *)in_RDI + 0x30) & 1) != 0) {
      local_2c = (uint)*local_18 - (uint)*(byte *)(*(long *)in_RDI + 0x2c);
      local_30 = (uint)local_18[1] - (uint)*(byte *)(*(long *)in_RDI + 0x2d);
      local_34 = (uint)local_18[2] - (uint)*(byte *)(*(long *)in_RDI + 0x2e);
      iVar2 = minimum<int>((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                           (int)in_stack_fffffffffffffed0,
                           CONCAT13(in_stack_fffffffffffffecf,
                                    CONCAT12(in_stack_fffffffffffffece,
                                             CONCAT11(in_stack_fffffffffffffecd,
                                                      in_stack_fffffffffffffecc))));
      if ((iVar2 < -4) ||
         (iVar2 = maximum<int>((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                               (int)in_stack_fffffffffffffed0,
                               CONCAT13(in_stack_fffffffffffffecf,
                                        CONCAT12(in_stack_fffffffffffffece,
                                                 CONCAT11(in_stack_fffffffffffffecd,
                                                          in_stack_fffffffffffffecc)))), 3 < iVar2))
      {
        *(undefined1 *)(local_20 + 10) = 0;
        return false;
      }
    }
    local_38.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         etc1_solution_coordinates::get_scaled_color(in_stack_fffffffffffffed8);
    local_3c = *(uint32_t *)(*(long *)in_RDI + 0xc);
    uVar3 = vector<unsigned_char>::size((vector<unsigned_char> *)(local_20 + 4));
    if (uVar3 != local_3c) {
      __assert_fail("trial_solution.m_selectors.size() == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                    ,0x519,
                    "bool basisu::etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates &, potential_solution &, potential_solution *)"
                   );
    }
    *(undefined8 *)(local_20 + 8) = 0xffffffffffffffff;
    if (**(int **)in_RDI == 0) {
      alpha = 0;
    }
    else {
      alpha = *(byte *)(*(long *)in_RDI + 4);
    }
    local_3d = alpha & 1;
    for (local_44 = 7; -1 < local_44; local_44 = local_44 + -1) {
      local_50 = g_etc1_inten_tables + (long)local_44 * 0x10;
      pSrc_pixels_00 = &local_68;
      c1 = local_78;
      do {
        in_stack_fffffffffffffed0 = c1;
        color_rgba::color_rgba((color_rgba *)&in_stack_fffffffffffffed0->field_1);
        c1 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(&in_stack_fffffffffffffed0->field_1 + 1);
      } while (c1 != pSrc_pixels_00);
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        local_80 = *(undefined4 *)(local_50 + (ulong)local_7c * 4);
        color_rgba::color_rgba
                  ((color_rgba *)&in_stack_fffffffffffffed0->field_1,
                   CONCAT13(in_stack_fffffffffffffecf,
                            CONCAT12(in_stack_fffffffffffffece,
                                     CONCAT11(in_stack_fffffffffffffecd,in_stack_fffffffffffffecc)))
                   ,in_stack_fffffffffffffec8,0,0x4dce42);
        *(uint *)(local_78[0].m_comps + (ulong)local_7c * 4) = local_90[3];
        (&local_68)[local_7c] =
             (anon_union_4_2_6eba8969_for_color_rgba_0)
             ((local_90[3] & 0xff) + (local_90[3] >> 8 & 0xff) + (local_90[3] >> 0x10 & 0xff));
      }
      local_90[0] = (int)local_68 + local_64;
      local_90[1] = local_64 + local_60;
      local_90[2] = local_60 + local_5c;
      local_98 = 0;
      if ((local_3d & 1) == 0) {
        if ((uint)(*(int *)(*(long *)(in_RDI + 0x1a) + (ulong)(local_3c - 1) * 4) << 1) <
            local_90[0]) {
          if (((uint)*(anon_union_4_2_6eba8969_for_color_rgba_0 *)
                      (*(long *)(in_RDI + 0x1a) + (ulong)(local_3c - 1) * 4) < (uint)local_68) &&
             (uVar3 = iabs((int)local_68 -
                           *(int *)(*(long *)(in_RDI + 0x1a) + (ulong)(local_3c - 1) * 4)),
             *(ulong *)(local_20 + 8) <= (ulong)uVar3)) goto LAB_004dd7fd;
          puVar4 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                              CONCAT17(in_stack_fffffffffffffecf,
                                       CONCAT16(in_stack_fffffffffffffece,
                                                CONCAT15(in_stack_fffffffffffffecd,
                                                         CONCAT14(in_stack_fffffffffffffecc,
                                                                  in_stack_fffffffffffffec8)))));
          memset(puVar4,0,(ulong)local_3c);
          for (local_e8 = 0; local_e8 < local_3c; local_e8 = local_e8 + 1) {
            iVar2 = color_distance((color_rgba *)CONCAT17(alpha,in_stack_fffffffffffffee8),
                                   (color_rgba *)&c1->field_1,SUB81((ulong)pSrc_pixels_00 >> 0x38,0)
                                  );
            local_98 = (long)iVar2 + local_98;
          }
        }
        else if ((uint)(**(int **)(in_RDI + 0x1a) << 1) < local_90[2]) {
          local_f4 = 0;
          for (local_f8 = 0; local_f8 < local_3c; local_f8 = local_f8 + 1) {
            while (local_90[local_f4] <=
                   (uint)(*(int *)(*(long *)(in_RDI + 0x1a) + (ulong)local_f8 * 4) << 1)) {
              local_f4 = local_f4 + 1;
              if (2 < local_f4) goto LAB_004dd706;
            }
            in_stack_ffffffffffffff00 =
                 *(undefined4 *)(*(long *)(in_RDI + 0x18) + (ulong)local_f8 * 4);
            in_stack_fffffffffffffecd = (uchar)local_f4;
            puVar4 = vector<unsigned_char>::operator[]
                               ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                CONCAT17(in_stack_fffffffffffffecf,
                                         CONCAT16(in_stack_fffffffffffffece,
                                                  CONCAT15(in_stack_fffffffffffffecd,
                                                           CONCAT14(in_stack_fffffffffffffecc,
                                                                    in_stack_fffffffffffffec8)))));
            *puVar4 = in_stack_fffffffffffffecd;
            iVar2 = color_distance((color_rgba *)CONCAT17(alpha,in_stack_fffffffffffffee8),
                                   (color_rgba *)&c1->field_1,SUB81((ulong)pSrc_pixels_00 >> 0x38,0)
                                  );
            local_98 = (long)iVar2 + local_98;
          }
LAB_004dd706:
          for (; local_f8 < local_3c; local_f8 = local_f8 + 1) {
            in_stack_fffffffffffffefc =
                 *(undefined4 *)(*(long *)(in_RDI + 0x18) + (ulong)local_f8 * 4);
            puVar4 = vector<unsigned_char>::operator[]
                               ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                CONCAT17(in_stack_fffffffffffffecf,
                                         CONCAT16(in_stack_fffffffffffffece,
                                                  CONCAT15(in_stack_fffffffffffffecd,
                                                           CONCAT14(in_stack_fffffffffffffecc,
                                                                    in_stack_fffffffffffffec8)))));
            *puVar4 = '\x03';
            iVar2 = color_distance((color_rgba *)CONCAT17(alpha,in_stack_fffffffffffffee8),
                                   (color_rgba *)&c1->field_1,SUB81((ulong)pSrc_pixels_00 >> 0x38,0)
                                  );
            local_98 = (long)iVar2 + local_98;
          }
        }
        else {
          if ((local_5c < **(uint **)(in_RDI + 0x1a)) &&
             (uVar3 = iabs(**(int **)(in_RDI + 0x1a) - local_5c),
             *(ulong *)(local_20 + 8) <= (ulong)uVar3)) goto LAB_004dd7fd;
          puVar4 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                              CONCAT17(in_stack_fffffffffffffecf,
                                       CONCAT16(in_stack_fffffffffffffece,
                                                CONCAT15(in_stack_fffffffffffffecd,
                                                         CONCAT14(in_stack_fffffffffffffecc,
                                                                  in_stack_fffffffffffffec8)))));
          memset(puVar4,3,(ulong)local_3c);
          for (local_f0 = 0; local_f0 < local_3c; local_f0 = local_f0 + 1) {
            iVar2 = color_distance((color_rgba *)CONCAT17(alpha,in_stack_fffffffffffffee8),
                                   (color_rgba *)&c1->field_1,SUB81((ulong)pSrc_pixels_00 >> 0x38,0)
                                  );
            local_98 = (long)iVar2 + local_98;
          }
        }
LAB_004dd787:
        if (local_98 < *(ulong *)(local_20 + 8)) {
          *(ulong *)(local_20 + 8) = local_98;
          local_20[1] = local_44;
          vector<unsigned_char>::swap
                    ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                     (vector<unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffecf,
                              CONCAT16(in_stack_fffffffffffffece,
                                       CONCAT15(in_stack_fffffffffffffecd,
                                                CONCAT14(in_stack_fffffffffffffecc,
                                                         in_stack_fffffffffffffec8)))));
          *(undefined1 *)(local_20 + 10) = 1;
          if (local_98 == 0) break;
        }
      }
      else {
        if (local_90[0] <=
            (uint)(*(int *)(*(long *)(in_RDI + 0x1a) + (ulong)(local_3c - 1) * 4) << 1)) {
          if ((uint)(**(int **)(in_RDI + 0x1a) << 1) < local_90[2]) {
            if ((g_cpu_supports_sse41 & 1) == 0) {
              local_b4 = 0;
              for (local_b8 = 0; local_b8 < local_3c; local_b8 = local_b8 + 1) {
                while (local_90[local_b4] <=
                       (uint)(*(int *)(*(long *)(in_RDI + 0x1a) + (ulong)local_b8 * 4) << 1)) {
                  local_b4 = local_b4 + 1;
                  if (2 < local_b4) goto LAB_004dd24f;
                }
                in_stack_fffffffffffffecf = (uchar)local_b4;
                puVar4 = vector<unsigned_char>::operator[]
                                   ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                    CONCAT17(in_stack_fffffffffffffecf,
                                             CONCAT16(in_stack_fffffffffffffece,
                                                      CONCAT15(in_stack_fffffffffffffecd,
                                                               CONCAT14(in_stack_fffffffffffffecc,
                                                                        in_stack_fffffffffffffec8)))
                                            ));
                *puVar4 = in_stack_fffffffffffffecf;
                uVar3 = color_distance(SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0),
                                       (color_rgba *)
                                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                       ,in_RDI,(bool)alpha);
                local_98 = uVar3 + local_98;
              }
LAB_004dd24f:
              for (; local_b8 < local_3c; local_b8 = local_b8 + 1) {
                puVar4 = vector<unsigned_char>::operator[]
                                   ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                    CONCAT17(in_stack_fffffffffffffecf,
                                             CONCAT16(in_stack_fffffffffffffece,
                                                      CONCAT15(in_stack_fffffffffffffecd,
                                                               CONCAT14(in_stack_fffffffffffffecc,
                                                                        in_stack_fffffffffffffec8)))
                                            ));
                *puVar4 = '\x03';
                uVar3 = color_distance(SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0),
                                       (color_rgba *)
                                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                       ,in_RDI,(bool)alpha);
                local_98 = uVar3 + local_98;
              }
            }
            else {
              local_c8 = 0;
              for (local_cc = 0; local_cc < local_3c; local_cc = local_cc + 1) {
                while (local_90[local_c8] <=
                       (uint)(*(int *)(*(long *)(in_RDI + 0x1a) + (ulong)local_cc * 4) << 1)) {
                  local_c8 = local_c8 + 1;
                  if (2 < local_c8) goto LAB_004dd383;
                }
                in_stack_fffffffffffffece = (uchar)local_c8;
                puVar4 = vector<unsigned_char>::operator[]
                                   ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                    CONCAT17(in_stack_fffffffffffffecf,
                                             CONCAT16(in_stack_fffffffffffffece,
                                                      CONCAT15(in_stack_fffffffffffffecd,
                                                               CONCAT14(in_stack_fffffffffffffecc,
                                                                        in_stack_fffffffffffffec8)))
                                            ));
                *puVar4 = in_stack_fffffffffffffece;
              }
LAB_004dd383:
              for (; local_cc < local_3c; local_cc = local_cc + 1) {
                puVar4 = vector<unsigned_char>::operator[]
                                   ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                    CONCAT17(in_stack_fffffffffffffecf,
                                             CONCAT16(in_stack_fffffffffffffece,
                                                      CONCAT15(in_stack_fffffffffffffecd,
                                                               CONCAT14(in_stack_fffffffffffffecc,
                                                                        in_stack_fffffffffffffec8)))
                                            ));
                *puVar4 = '\x03';
              }
              vector<unsigned_char>::operator[]
                        ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                         CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,
                                           CONCAT15(in_stack_fffffffffffffecd,
                                                    CONCAT14(in_stack_fffffffffffffecc,
                                                             in_stack_fffffffffffffec8)))));
              perceptual_distance_rgb_4_N_sse41
                        ((int64_t *)in_RDI,(uint8_t *)CONCAT17(alpha,in_stack_fffffffffffffee8),
                         (color_rgba *)&c1->field_1,(color_rgba *)&pSrc_pixels_00->field_1,
                         (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,
                                           CONCAT15(in_stack_fffffffffffffecd,
                                                    CONCAT14(in_stack_fffffffffffffecc,
                                                             in_stack_fffffffffffffec8)))));
              local_98 = local_e0;
            }
          }
          else {
            if ((local_5c < **(uint **)(in_RDI + 0x1a)) &&
               (uVar3 = iabs(**(int **)(in_RDI + 0x1a) - local_5c),
               *(ulong *)(local_20 + 8) <= (ulong)uVar3)) goto LAB_004dd7fd;
            puVar4 = vector<unsigned_char>::operator[]
                               ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                                CONCAT17(in_stack_fffffffffffffecf,
                                         CONCAT16(in_stack_fffffffffffffece,
                                                  CONCAT15(in_stack_fffffffffffffecd,
                                                           CONCAT14(in_stack_fffffffffffffecc,
                                                                    in_stack_fffffffffffffec8)))));
            memset(puVar4,3,(ulong)local_3c);
            for (local_b0 = 0; local_b0 < local_3c; local_b0 = local_b0 + 1) {
              uVar3 = color_distance(SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0),
                                     (color_rgba *)
                                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                     in_RDI,(bool)alpha);
              local_98 = uVar3 + local_98;
            }
          }
          goto LAB_004dd787;
        }
        if (((uint)local_68 <=
             (uint)*(anon_union_4_2_6eba8969_for_color_rgba_0 *)
                    (*(long *)(in_RDI + 0x1a) + (ulong)(local_3c - 1) * 4)) ||
           (uVar3 = iabs((int)local_68 -
                         *(int *)(*(long *)(in_RDI + 0x1a) + (ulong)(local_3c - 1) * 4)),
           (ulong)uVar3 < *(ulong *)(local_20 + 8))) {
          puVar4 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)&in_stack_fffffffffffffed0->field_1,
                              CONCAT17(in_stack_fffffffffffffecf,
                                       CONCAT16(in_stack_fffffffffffffece,
                                                CONCAT15(in_stack_fffffffffffffecd,
                                                         CONCAT14(in_stack_fffffffffffffecc,
                                                                  in_stack_fffffffffffffec8)))));
          memset(puVar4,0,(ulong)local_3c);
          for (local_a8 = 0; local_a8 < local_3c; local_a8 = local_a8 + 1) {
            uVar3 = color_distance(SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0),
                                   (color_rgba *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                   in_RDI,(bool)alpha);
            local_98 = uVar3 + local_98;
          }
          goto LAB_004dd787;
        }
      }
LAB_004dd7fd:
    }
    *local_20 = *(undefined4 *)local_18;
    *(byte *)(local_20 + 2) = *(byte *)(*(long *)in_RDI + 0x18) & 1;
    local_1 = false;
    if ((local_28 != 0) &&
       (local_1 = *(ulong *)(local_20 + 8) < *(ulong *)(local_28 + 0x20), local_1)) {
      potential_solution::operator=
                ((potential_solution *)&in_stack_fffffffffffffed0->field_1,
                 (potential_solution *)
                 CONCAT17(in_stack_fffffffffffffecf,
                          CONCAT16(in_stack_fffffffffffffece,
                                   CONCAT15(in_stack_fffffffffffffecd,
                                            CONCAT14(in_stack_fffffffffffffecc,
                                                     in_stack_fffffffffffffec8)))));
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
	{
		if (!check_for_redundant_solution(coords))
			return false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval solution fast: %u %u %u\n", coords.m_unscaled_color.r, coords.m_unscaled_color.g, coords.m_unscaled_color.b);
#endif

		if (m_pParams->m_constrain_against_base_color5)
		{
			const int dr = (int)coords.m_unscaled_color.r - (int)m_pParams->m_base_color5.r;
			const int dg = (int)coords.m_unscaled_color.g - (int)m_pParams->m_base_color5.g;
			const int db = (int)coords.m_unscaled_color.b - (int)m_pParams->m_base_color5.b;

			if ((minimum(dr, dg, db) < cETC1ColorDeltaMin) || (maximum(dr, dg, db) > cETC1ColorDeltaMax))
			{
				trial_solution.m_valid = false;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
				printf("Eval failed due to constraint from %u %u %u\n", m_pParams->m_base_color5.r, m_pParams->m_base_color5.g, m_pParams->m_base_color5.b);
#endif
				return false;
			}
		}

		const color_rgba base_color(coords.get_scaled_color());
		
		const uint32_t n = m_pParams->m_num_src_pixels;
		assert(trial_solution.m_selectors.size() == n);

		trial_solution.m_error = UINT64_MAX;
								
		const bool perceptual = (m_pParams->m_quality == cETCQualityFast) ? false : m_pParams->m_perceptual;
				
		for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
		{
			const int* pInten_table = g_etc1_inten_tables[inten_table];

			uint32_t block_inten[4];
			color_rgba block_colors[4];
			for (uint32_t s = 0; s < 4; s++)
			{
				const int yd = pInten_table[s];
				color_rgba block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 255);
				block_colors[s] = block_color;
				block_inten[s] = block_color.r + block_color.g + block_color.b;
			}

			// evaluate_solution_fast() enforces/assumes a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
			// The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
			// 0   1   2   3
			//   01  12  23
			const uint32_t block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };
															
			uint64_t total_error = 0;
			const color_rgba* pSrc_pixels = m_pParams->m_pSrc_pixels;
						
			if (perceptual)
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(true, block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					if (!g_cpu_supports_sse41)
					{
						uint32_t cur_selector = 0, c;
						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
								if (++cur_selector > 2)
									goto done;
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
							total_error += color_distance(true, block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
						}
					done:
						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							total_error += color_distance(true, block_colors[3], pSrc_pixels[sorted_pixel_index], false);
							++c;
						}
					}
					else
					{
#if BASISU_SUPPORT_SSE
						uint32_t cur_selector = 0, c;

						for (c = 0; c < n; c++)
						{
							const uint32_t y = m_pSorted_luma[c];
							while ((y * 2) >= block_inten_midpoints[cur_selector])
							{
								if (++cur_selector > 2)
									goto done3;
							}
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						}
					done3:

						while (c < n)
						{
							const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
							m_temp_selectors[sorted_pixel_index] = 3;
							++c;
						}

						int64_t block_error;
						perceptual_distance_rgb_4_N_sse41(&block_error, &m_temp_selectors[0], block_colors, pSrc_pixels, n, INT64_MAX);
						total_error += block_error;
#endif
					}
				}
			}
			else
			{
				if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
				{
					if (block_inten[0] > m_pSorted_luma[n - 1])
					{
						const uint32_t min_error = iabs((int)block_inten[0] - (int)m_pSorted_luma[n - 1]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 0, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[0], pSrc_pixels[c], false);
				}
				else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
				{
					if (m_pSorted_luma[0] > block_inten[3])
					{
						const uint32_t min_error = iabs((int)m_pSorted_luma[0] - (int)block_inten[3]);
						if (min_error >= trial_solution.m_error)
							continue;
					}

					memset(&m_temp_selectors[0], 3, n);

					for (uint32_t c = 0; c < n; c++)
						total_error += color_distance(block_colors[3], pSrc_pixels[c], false);
				}
				else
				{
					uint32_t cur_selector = 0, c;
					for (c = 0; c < n; c++)
					{
						const uint32_t y = m_pSorted_luma[c];
						while ((y * 2) >= block_inten_midpoints[cur_selector])
							if (++cur_selector > 2)
								goto done2;
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = static_cast<uint8_t>(cur_selector);
						total_error += color_distance(block_colors[cur_selector], pSrc_pixels[sorted_pixel_index], false);
					}
				done2:
					while (c < n)
					{
						const uint32_t sorted_pixel_index = m_pSorted_luma_indices[c];
						m_temp_selectors[sorted_pixel_index] = 3;
						total_error += color_distance(block_colors[3], pSrc_pixels[sorted_pixel_index], false);
						++c;
					}
				}
			}

			if (total_error < trial_solution.m_error)
			{
				trial_solution.m_error = total_error;
				trial_solution.m_coords.m_inten_table = inten_table;
				trial_solution.m_selectors.swap(m_temp_selectors);
				trial_solution.m_valid = true;
				if (!total_error)
					break;
			}
		}
		trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
		trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
		printf("Eval done: %u error: %I64u best error so far: %I64u\n", (trial_solution.m_error < pBest_solution->m_error), trial_solution.m_error, pBest_solution->m_error);
#endif

		bool success = false;
		if (pBest_solution)
		{
			if (trial_solution.m_error < pBest_solution->m_error)
			{
				*pBest_solution = trial_solution;
				success = true;
			}
		}

		return success;
	}